

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateHuffmanBlock(ucvector *out,LodePNGBitReader *reader,uint btype)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong local_a8;
  size_t forward;
  size_t length;
  size_t backward;
  size_t start;
  uint numextrabits_d;
  uint numextrabits_l;
  uint distance;
  uint code_d;
  uint code_ll;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  uint error;
  uint btype_local;
  LodePNGBitReader *reader_local;
  ucvector *out_local;
  
  HuffmanTree_init((HuffmanTree *)&tree_d.table_value);
  HuffmanTree_init((HuffmanTree *)&code_d);
  if (btype == 1) {
    tree_ll.table_value._0_4_ =
         getTreeInflateFixed((HuffmanTree *)&tree_d.table_value,(HuffmanTree *)&code_d);
  }
  else {
    tree_ll.table_value._0_4_ =
         getTreeInflateDynamic((HuffmanTree *)&tree_d.table_value,(HuffmanTree *)&code_d,reader);
  }
  do {
    if ((uint)tree_ll.table_value != 0) goto LAB_00133df9;
    ensureBits25(reader,0x14);
    uVar2 = huffmanDecodeSymbol(reader,(HuffmanTree *)&tree_d.table_value);
    if (uVar2 < 0x100) {
      uVar3 = ucvector_resize(out,out->size + 1);
      if (uVar3 == 0) {
        tree_ll.table_value._0_4_ = 0x53;
        goto LAB_00133df9;
      }
      out->data[out->size - 1] = (uchar)uVar2;
    }
    else {
      if ((uVar2 < 0x101) || (0x11d < uVar2)) {
        if (uVar2 != 0x100) {
          tree_ll.table_value._0_4_ = 0x10;
        }
        goto LAB_00133df9;
      }
      forward = (size_t)LENGTHBASE[uVar2 - 0x101];
      if (LENGTHEXTRA[uVar2 - 0x101] != 0) {
        uVar2 = readBits(reader,(ulong)LENGTHEXTRA[uVar2 - 0x101]);
        forward = uVar2 + forward;
      }
      ensureBits32(reader,0x1c);
      uVar2 = huffmanDecodeSymbol(reader,(HuffmanTree *)&code_d);
      if (0x1d < uVar2) {
        if (uVar2 < 0x20) {
          tree_ll.table_value._0_4_ = 0x12;
        }
        else {
          tree_ll.table_value._0_4_ = 0x10;
        }
        goto LAB_00133df9;
      }
      numextrabits_d = DISTANCEBASE[uVar2];
      if (DISTANCEEXTRA[uVar2] != 0) {
        uVar2 = readBits(reader,(ulong)DISTANCEEXTRA[uVar2]);
        numextrabits_d = uVar2 + numextrabits_d;
      }
      uVar1 = out->size;
      if (uVar1 < numextrabits_d) {
        tree_ll.table_value._0_4_ = 0x34;
        goto LAB_00133df9;
      }
      length = uVar1 - numextrabits_d;
      uVar2 = ucvector_resize(out,out->size + forward);
      if (uVar2 == 0) {
        tree_ll.table_value._0_4_ = 0x53;
        goto LAB_00133df9;
      }
      if (numextrabits_d < forward) {
        lodepng_memcpy(out->data + uVar1,out->data + length,(ulong)numextrabits_d);
        backward = numextrabits_d + uVar1;
        for (local_a8 = (ulong)numextrabits_d; local_a8 < forward; local_a8 = local_a8 + 1) {
          out->data[backward] = out->data[length];
          length = length + 1;
          backward = backward + 1;
        }
      }
      else {
        lodepng_memcpy(out->data + uVar1,out->data + length,forward);
      }
    }
  } while (reader->bp <= reader->bitsize);
  tree_ll.table_value._0_4_ = 0x33;
LAB_00133df9:
  HuffmanTree_cleanup((HuffmanTree *)&tree_d.table_value);
  HuffmanTree_cleanup((HuffmanTree *)&code_d);
  return (uint)tree_ll.table_value;
}

Assistant:

static unsigned inflateHuffmanBlock(ucvector* out, LodePNGBitReader* reader,
                                    unsigned btype) {
  unsigned error = 0;
  HuffmanTree tree_ll; /*the huffman tree for literal and length codes*/
  HuffmanTree tree_d; /*the huffman tree for distance codes*/

  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);

  if(btype == 1) error = getTreeInflateFixed(&tree_ll, &tree_d);
  else /*if(btype == 2)*/ error = getTreeInflateDynamic(&tree_ll, &tree_d, reader);

  while(!error) /*decode all symbols until end reached, breaks at end code*/ {
    /*code_ll is literal, length or end code*/
    unsigned code_ll;
    ensureBits25(reader, 20); /* up to 15 for the huffman symbol, up to 5 for the length extra bits */
    code_ll = huffmanDecodeSymbol(reader, &tree_ll);
    if(code_ll <= 255) /*literal symbol*/ {
      if(!ucvector_resize(out, out->size + 1)) ERROR_BREAK(83 /*alloc fail*/);
      out->data[out->size - 1] = (unsigned char)code_ll;
    } else if(code_ll >= FIRST_LENGTH_CODE_INDEX && code_ll <= LAST_LENGTH_CODE_INDEX) /*length code*/ {
      unsigned code_d, distance;
      unsigned numextrabits_l, numextrabits_d; /*extra bits for length and distance*/
      size_t start, backward, length;

      /*part 1: get length base*/
      length = LENGTHBASE[code_ll - FIRST_LENGTH_CODE_INDEX];

      /*part 2: get extra bits and add the value of that to length*/
      numextrabits_l = LENGTHEXTRA[code_ll - FIRST_LENGTH_CODE_INDEX];
      if(numextrabits_l != 0) {
        /* bits already ensured above */
        length += readBits(reader, numextrabits_l);
      }

      /*part 3: get distance code*/
      ensureBits32(reader, 28); /* up to 15 for the huffman symbol, up to 13 for the extra bits */
      code_d = huffmanDecodeSymbol(reader, &tree_d);
      if(code_d > 29) {
        if(code_d <= 31) {
          ERROR_BREAK(18); /*error: invalid distance code (30-31 are never used)*/
        } else /* if(code_d == INVALIDSYMBOL) */{
          ERROR_BREAK(16); /*error: tried to read disallowed huffman symbol*/
        }
      }
      distance = DISTANCEBASE[code_d];

      /*part 4: get extra bits from distance*/
      numextrabits_d = DISTANCEEXTRA[code_d];
      if(numextrabits_d != 0) {
        /* bits already ensured above */
        distance += readBits(reader, numextrabits_d);
      }

      /*part 5: fill in all the out[n] values based on the length and dist*/
      start = out->size;
      if(distance > start) ERROR_BREAK(52); /*too long backward distance*/
      backward = start - distance;

      if(!ucvector_resize(out, out->size + length)) ERROR_BREAK(83 /*alloc fail*/);
      if(distance < length) {
        size_t forward;
        lodepng_memcpy(out->data + start, out->data + backward, distance);
        start += distance;
        for(forward = distance; forward < length; ++forward) {
          out->data[start++] = out->data[backward++];
        }
      } else {
        lodepng_memcpy(out->data + start, out->data + backward, length);
      }
    } else if(code_ll == 256) {
      break; /*end code, break the loop*/
    } else /*if(code_ll == INVALIDSYMBOL)*/ {
      ERROR_BREAK(16); /*error: tried to read disallowed huffman symbol*/
    }
    /*check if any of the ensureBits above went out of bounds*/
    if(reader->bp > reader->bitsize) {
      /*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
      (10=no endcode, 11=wrong jump outside of tree)*/
      /* TODO: revise error codes 10,11,50: the above comment is no longer valid */
      ERROR_BREAK(51); /*error, bit pointer jumps past memory*/
    }
  }

  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);

  return error;
}